

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

void __thiscall LexicalAnalyzer::lookingForEndOfStatement(LexicalAnalyzer *this,string *str)

{
  bool bVar1;
  char *pcVar2;
  ostream *this_00;
  bool fOpened;
  uint index;
  string *str_local;
  LexicalAnalyzer *this_local;
  
  bVar1 = false;
  while( true ) {
    do {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    } while (*pcVar2 == ' ');
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == ';') break;
    if (bVar1) {
      std::__cxx11::string::operator[]((ulong)str);
      std::__cxx11::string::push_back((char)this + '0');
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
    if (*pcVar2 == '{') {
      bVar1 = true;
    }
  }
  std::__cxx11::string::operator[]((ulong)str);
  std::__cxx11::string::push_back((char)this + '0');
  this_00 = std::operator<<((ostream *)&std::cout,(string *)&this->m_Statement);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LexicalAnalyzer::lookingForEndOfStatement(string str){
    unsigned index = 0;
    bool fOpened = false;
    for(index; ;index++){
        if(str[index] == ' ')
            continue;
        if(str[index] == ';'){
            m_Statement.push_back(str[index]);
            break;
        }

        if(fOpened)
            m_Statement.push_back(str[index]);
        if(str[index] == '{')
            fOpened = true;
    }
    cout << m_Statement << endl;
    return;
}